

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_Subscription_publishCallback(UA_Server *server,UA_Subscription *sub)

{
  UA_NotificationMessage *p;
  uint uVar1;
  UA_Session *pUVar2;
  UA_SecureChannel *pUVar3;
  UA_PublishResponseEntry *__ptr;
  MonitoredItem_queuedValue *pMVar4;
  ulong uVar5;
  MonitoredItem_queuedValue *pMVar6;
  UA_PublishResponseEntry *pUVar7;
  UA_NotificationMessageEntry *pUVar8;
  size_t size;
  UA_StatusCode *p_00;
  UA_DateTime UVar9;
  bool bVar10;
  MonitoredItem_queuedValue *pMVar11;
  UA_NotificationMessageEntry *pUVar12;
  anon_struct_16_2_4dd83919_for_listEntry *paVar13;
  undefined4 uVar14;
  uint uVar15;
  UA_UInt32 UVar16;
  UA_MonitoredItem *pUVar17;
  UA_ExtensionObject *pUVar18;
  ulong *puVar19;
  void *pvVar20;
  MonitoredItem_queuedValue *pMVar21;
  UA_UInt32 *pUVar22;
  ulong uVar23;
  long lVar24;
  UA_NotificationMessageEntry *pUVar25;
  UA_UInt32 *pUVar26;
  UA_DataValue *pUVar27;
  undefined8 *puVar28;
  long lVar29;
  ulong uVar30;
  byte bVar31;
  UA_UInt32 aUStack_88 [2];
  undefined1 local_80 [8];
  timeval tv;
  UA_NotificationMessageEntry *local_58;
  
  bVar31 = 0;
  pUVar26 = aUStack_88;
  pUVar2 = sub->session;
  if ((sub->publishingEnabled == true) &&
     (pUVar17 = (sub->monitoredItems).lh_first, pUVar17 != (UA_MonitoredItem *)0x0)) {
    bVar10 = false;
    uVar23 = 0;
    do {
      pMVar21 = (pUVar17->queue).tqh_first;
      if (pMVar21 != (MonitoredItem_queuedValue *)0x0) {
        uVar30 = (ulong)sub->notificationsPerPublish;
        if (sub->notificationsPerPublish < uVar23) {
          uVar30 = uVar23;
        }
        do {
          if (uVar30 == uVar23) {
            bVar10 = true;
            uVar23 = uVar30;
            break;
          }
          uVar23 = uVar23 + 1;
          pMVar21 = (pMVar21->listEntry).tqe_next;
        } while (pMVar21 != (MonitoredItem_queuedValue *)0x0);
      }
      pUVar17 = (pUVar17->listEntry).le_next;
    } while (pUVar17 != (UA_MonitoredItem *)0x0);
  }
  else {
    bVar10 = false;
    uVar23 = 0;
  }
  pUVar3 = pUVar2->channel;
  if (uVar23 == 0) {
    uVar15 = sub->currentKeepAliveCount + 1;
    sub->currentKeepAliveCount = uVar15;
    if (pUVar3 == (UA_SecureChannel *)0x0) {
      return;
    }
    if (uVar15 < sub->maxKeepAliveCount) {
      return;
    }
  }
  else if (pUVar3 == (UA_SecureChannel *)0x0) {
    return;
  }
  __ptr = (pUVar2->responseQueue).sqh_first;
  if (__ptr == (UA_PublishResponseEntry *)0x0) {
    if (sub->state != UA_SUBSCRIPTIONSTATE_LATE) {
      sub->state = UA_SUBSCRIPTIONSTATE_LATE;
      return;
    }
    uVar15 = sub->currentLifetimeCount + 1;
    sub->currentLifetimeCount = uVar15;
    if (uVar15 <= sub->lifeTimeCount) {
      return;
    }
    UA_Session_deleteSubscription(server,pUVar2,sub->subscriptionID);
    return;
  }
  p = &(__ptr->response).notificationMessage;
  if (uVar23 != 0) {
    local_58 = (UA_NotificationMessageEntry *)malloc(0x30);
    if (local_58 == (UA_NotificationMessageEntry *)0x0) {
      if (pUVar3->connection == (UA_Connection *)0x0) {
        uVar23 = 0;
      }
      else {
        uVar23 = (ulong)(uint)pUVar3->connection->sockfd;
      }
      UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_SESSION,
                     "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not allocate memory for retransmission"
                     ,uVar23,(ulong)(pUVar3->securityToken).channelId,
                     (ulong)(pUVar2->sessionId).identifier.numeric,
                     (ulong)(pUVar2->sessionId).identifier.guid.data2,
                     (ulong)(pUVar2->sessionId).identifier.guid.data3,
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[0],
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[1],
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[2],
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[3],
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[4],
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[5],
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[6],
                     (ulong)(pUVar2->sessionId).identifier.guid.data4[7],(ulong)sub->subscriptionID)
      ;
      return;
    }
    pUVar18 = (UA_ExtensionObject *)calloc(1,0x30);
    (__ptr->response).notificationMessage.notificationData = pUVar18;
    if (pUVar18 != (UA_ExtensionObject *)0x0) {
      (__ptr->response).notificationMessage.notificationDataSize = 1;
      puVar19 = (ulong *)calloc(1,0x20);
      if (puVar19 != (ulong *)0x0) {
        pUVar18->encoding = UA_EXTENSIONOBJECT_DECODED;
        (pUVar18->content).decoded.data = puVar19;
        (pUVar18->content).decoded.type = (UA_DataType *)0x1408e0;
        pvVar20 = calloc(uVar23,0x68);
        puVar19[1] = (ulong)pvVar20;
        if (pvVar20 != (void *)0x0) {
          *puVar19 = uVar23;
          pUVar17 = (sub->monitoredItems).lh_first;
          if (pUVar17 != (UA_MonitoredItem *)0x0) {
            uVar30 = 0;
            tv.tv_usec = (__suseconds_t)sub;
            do {
              pMVar21 = (pUVar17->queue).tqh_first;
              if (pMVar21 != (MonitoredItem_queuedValue *)0x0) {
                lVar29 = uVar30 * 0x68 + 8;
                do {
                  if (uVar23 <= uVar30) goto LAB_00124cc4;
                  pMVar4 = (pMVar21->listEntry).tqe_next;
                  uVar5 = puVar19[1];
                  *(UA_UInt32 *)((uVar5 - 8) + lVar29) = pMVar21->clientHandle;
                  pUVar27 = &pMVar21->value;
                  puVar28 = (undefined8 *)(uVar5 + lVar29);
                  for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
                    *puVar28 = *(undefined8 *)pUVar27;
                    pUVar27 = (UA_DataValue *)((long)pUVar27 + ((ulong)bVar31 * -2 + 1) * 8);
                    puVar28 = puVar28 + (ulong)bVar31 * -2 + 1;
                  }
                  pMVar6 = (pMVar21->listEntry).tqe_next;
                  pMVar11 = pMVar6;
                  if (pMVar6 == (MonitoredItem_queuedValue *)0x0) {
                    pMVar11 = (MonitoredItem_queuedValue *)&pUVar17->queue;
                  }
                  (pMVar11->listEntry).tqe_prev = (pMVar21->listEntry).tqe_prev;
                  *(pMVar21->listEntry).tqe_prev = pMVar6;
                  free(pMVar21);
                  pUVar17->currentQueueSize = pUVar17->currentQueueSize - 1;
                  uVar30 = uVar30 + 1;
                  lVar29 = lVar29 + 0x68;
                  pMVar21 = pMVar4;
                  sub = (UA_Subscription *)tv.tv_usec;
                } while (pMVar4 != (MonitoredItem_queuedValue *)0x0);
              }
              pUVar17 = (pUVar17->listEntry).le_next;
            } while (pUVar17 != (UA_MonitoredItem *)0x0);
          }
          goto LAB_00124cc4;
        }
      }
      deleteMembers_noInit(p,UA_TYPES + 0x22);
      (__ptr->response).notificationMessage.notificationDataSize = 0;
      (__ptr->response).notificationMessage.notificationData = (UA_ExtensionObject *)0x0;
      *(undefined8 *)p = 0;
      (__ptr->response).notificationMessage.publishTime = 0;
    }
    pUVar2 = sub->session;
    pUVar3 = pUVar2->channel;
    uVar30 = 0;
    uVar23 = 0;
    if ((pUVar3 != (UA_SecureChannel *)0x0) && (pUVar3->connection != (UA_Connection *)0x0)) {
      uVar23 = (ulong)(uint)pUVar3->connection->sockfd;
    }
    if (pUVar3 != (UA_SecureChannel *)0x0) {
      uVar30 = (ulong)(pUVar3->securityToken).channelId;
    }
    UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not prepare the notification message"
                   ,uVar23,uVar30,(ulong)(pUVar2->sessionId).identifier.numeric,
                   (ulong)(pUVar2->sessionId).identifier.guid.data2,
                   (ulong)(pUVar2->sessionId).identifier.guid.data3,
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[0],
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[1],
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[2],
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[3],
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[4],
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[5],
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[6],
                   (ulong)(pUVar2->sessionId).identifier.guid.data4[7],(ulong)sub->subscriptionID);
    free(local_58);
    return;
  }
  local_58 = (UA_NotificationMessageEntry *)0x0;
LAB_00124cc4:
  pUVar2 = sub->session;
  pUVar7 = (((pUVar2->responseQueue).sqh_first)->listEntry).sqe_next;
  (pUVar2->responseQueue).sqh_first = pUVar7;
  if (pUVar7 == (UA_PublishResponseEntry *)0x0) {
    (pUVar2->responseQueue).sqh_last = &(pUVar2->responseQueue).sqh_first;
  }
  gettimeofday((timeval *)local_80,(__timezone_ptr_t)0x0);
  lVar29 = (long)local_80 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
  (__ptr->response).responseHeader.timestamp = lVar29;
  (__ptr->response).subscriptionId = sub->subscriptionID;
  (__ptr->response).moreNotifications = bVar10;
  (__ptr->response).notificationMessage.publishTime = lVar29;
  UVar16 = sub->sequenceNumber + 1;
  if (uVar23 == 0) {
    p->sequenceNumber = UVar16;
  }
  else {
    sub->sequenceNumber = UVar16;
    p->sequenceNumber = UVar16;
    pUVar18 = (__ptr->response).notificationMessage.notificationData;
    (local_58->message).notificationDataSize =
         (__ptr->response).notificationMessage.notificationDataSize;
    (local_58->message).notificationData = pUVar18;
    uVar14 = *(undefined4 *)&p->field_0x4;
    UVar9 = (__ptr->response).notificationMessage.publishTime;
    (local_58->message).sequenceNumber = p->sequenceNumber;
    *(undefined4 *)&(local_58->message).field_0x4 = uVar14;
    (local_58->message).publishTime = UVar9;
    uVar15 = (server->config).maxRetransmissionQueueSize;
    if ((uVar15 != 0) && (uVar1 = sub->retransmissionQueueSize, uVar15 <= uVar1)) {
      pUVar25 = ((sub->retransmissionQueue).tqh_last[1]->listEntry).tqe_next;
      pUVar8 = (pUVar25->listEntry).tqe_next;
      pUVar12 = pUVar8;
      if (pUVar8 == (UA_NotificationMessageEntry *)0x0) {
        pUVar12 = (UA_NotificationMessageEntry *)&sub->retransmissionQueue;
      }
      (pUVar12->listEntry).tqe_prev = (pUVar25->listEntry).tqe_prev;
      *(pUVar25->listEntry).tqe_prev = pUVar8;
      sub->retransmissionQueueSize = uVar1 - 1;
      deleteMembers_noInit(&pUVar25->message,UA_TYPES + 0x22);
      (pUVar25->message).notificationDataSize = 0;
      (pUVar25->message).notificationData = (UA_ExtensionObject *)0x0;
      *(undefined8 *)&pUVar25->message = 0;
      (pUVar25->message).publishTime = 0;
      free(pUVar25);
    }
    pUVar25 = (sub->retransmissionQueue).tqh_first;
    (local_58->listEntry).tqe_next = pUVar25;
    paVar13 = (anon_struct_16_2_4dd83919_for_listEntry *)&sub->retransmissionQueue;
    if (pUVar25 != (UA_NotificationMessageEntry *)0x0) {
      paVar13 = &pUVar25->listEntry;
    }
    paVar13->tqe_prev = (UA_NotificationMessageEntry **)local_58;
    (sub->retransmissionQueue).tqh_first = local_58;
    (local_58->listEntry).tqe_prev = &(sub->retransmissionQueue).tqh_first;
    sub->retransmissionQueueSize = sub->retransmissionQueueSize + 1;
  }
  uVar23 = (ulong)sub->retransmissionQueueSize;
  if (uVar23 != 0) {
    pUVar26 = (UA_UInt32 *)((long)aUStack_88 - (uVar23 * 4 + 0xf & 0xfffffffffffffff0));
    (__ptr->response).availableSequenceNumbers = pUVar26;
    (__ptr->response).availableSequenceNumbersSize = uVar23;
    pUVar22 = pUVar26;
    for (pUVar25 = (sub->retransmissionQueue).tqh_first;
        pUVar25 != (UA_NotificationMessageEntry *)0x0; pUVar25 = (pUVar25->listEntry).tqe_next) {
      *pUVar22 = (pUVar25->message).sequenceNumber;
      pUVar22 = pUVar22 + 1;
    }
  }
  pUVar3 = sub->session->channel;
  UVar16 = __ptr->requestId;
  pUVar26[-2] = 0x124e9e;
  pUVar26[-1] = 0;
  UA_SecureChannel_sendBinaryMessage(pUVar3,UVar16,&__ptr->response,UA_TYPES + 0x4e);
  sub->state = UA_SUBSCRIPTIONSTATE_NORMAL;
  sub->currentKeepAliveCount = 0;
  sub->currentLifetimeCount = 0;
  size = (__ptr->response).resultsSize;
  p_00 = (__ptr->response).results;
  pUVar26[-2] = 0x124ec7;
  pUVar26[-1] = 0;
  UA_Array_delete(p_00,size,UA_TYPES + 6);
  pUVar26[-2] = 0x124ecf;
  pUVar26[-1] = 0;
  free(__ptr);
  if (bVar10) {
    pUVar26[-2] = 0x124ee4;
    pUVar26[-1] = 0;
    UA_Subscription_publishCallback(server,sub);
  }
  return;
}

Assistant:

void UA_Subscription_publishCallback(UA_Server *server, UA_Subscription *sub) {
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                         "Publish Callback", sub->subscriptionID);

    /* Count the available notifications */
    UA_Boolean moreNotifications = false;
    size_t notifications = countQueuedNotifications(sub, &moreNotifications);

    /* Return if nothing to do */
    if(notifications == 0) {
        ++sub->currentKeepAliveCount;
        if(sub->currentKeepAliveCount < sub->maxKeepAliveCount)
            return;
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Sending a KeepAlive",
                             sub->subscriptionID)
    }

    /* Check if the securechannel is valid */
    UA_SecureChannel *channel = sub->session->channel;
    if(!channel)
        return;

    /* Dequeue a response */
    UA_PublishResponseEntry *pre = SIMPLEQ_FIRST(&sub->session->responseQueue);

    /* Cannot publish without a response */
    if(!pre) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Cannot send a publish response "
                             "since the publish queue is empty", sub->subscriptionID)
        if(sub->state != UA_SUBSCRIPTIONSTATE_LATE) {
            sub->state = UA_SUBSCRIPTIONSTATE_LATE;
        } else {
            ++sub->currentLifetimeCount;
            if(sub->currentLifetimeCount > sub->lifeTimeCount) {
                UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                                     "End of lifetime for subscription", sub->subscriptionID);
                UA_Session_deleteSubscription(server, sub->session, sub->subscriptionID);
            }
        }
        return;
    }

    UA_PublishResponse *response = &pre->response;
    UA_NotificationMessage *message = &response->notificationMessage;
    UA_NotificationMessageEntry *retransmission = NULL;
    if(notifications > 0) {
        /* Allocate the retransmission entry */
        retransmission = UA_malloc(sizeof(UA_NotificationMessageEntry));
        if(!retransmission) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not allocate memory "
                                   "for retransmission", sub->subscriptionID);
            return;
        }
        /* Prepare the response */
        UA_StatusCode retval =
            prepareNotificationMessage(sub, message, notifications);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not prepare the "
                                   "notification message", sub->subscriptionID);
            UA_free(retransmission);
            return;
        }
    }

    /* <-- The point of no return --> */

    /* Remove the response from the response queue */
    SIMPLEQ_REMOVE_HEAD(&sub->session->responseQueue, listEntry);

    /* Set up the response */
    response->responseHeader.timestamp = UA_DateTime_now();
    response->subscriptionId = sub->subscriptionID;
    response->moreNotifications = moreNotifications;
    message->publishTime = response->responseHeader.timestamp;
    if(notifications == 0) {
        /* Send sequence number for the next notification */
        message->sequenceNumber = sub->sequenceNumber + 1;
    } else {
        /* Increase the sequence number */
        message->sequenceNumber = ++sub->sequenceNumber;

        /* Put the notification message into the retransmission queue. This needs to
         * be done here, so that the message itself is included in the available
         * sequence numbers for acknowledgement. */
        retransmission->message = response->notificationMessage;
        UA_Subscription_addRetransmissionMessage(server, sub, retransmission);
    }

    /* Get the available sequence numbers from the retransmission queue */
    size_t available = sub->retransmissionQueueSize;
    if(available > 0) {
        response->availableSequenceNumbers = UA_alloca(available * sizeof(UA_UInt32));
        response->availableSequenceNumbersSize = available;
        size_t i = 0;
        UA_NotificationMessageEntry *nme;
        TAILQ_FOREACH(nme, &sub->retransmissionQueue, listEntry) {
            response->availableSequenceNumbers[i] = nme->message.sequenceNumber;
            ++i;
        }
    }

    /* Send the response */
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Sending out a publish response with %u "
                         "notifications", sub->subscriptionID, (UA_UInt32)notifications);
    UA_SecureChannel_sendBinaryMessage(sub->session->channel, pre->requestId, response,
                                       &UA_TYPES[UA_TYPES_PUBLISHRESPONSE]);

    /* Reset subscription state to normal. */
    sub->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    sub->currentKeepAliveCount = 0;
    sub->currentLifetimeCount = 0;

    /* Free the response */
    UA_Array_delete(response->results, response->resultsSize,
                    &UA_TYPES[UA_TYPES_UINT32]);
    UA_free(pre); /* no need for UA_PublishResponse_deleteMembers */

    /* Repeat if there are more notifications to send */
    if(moreNotifications)
        UA_Subscription_publishCallback(server, sub);
}